

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 02_position_offline.cpp
# Opt level: O2

int main(void)

{
  Result RVar1;
  ostream *poVar2;
  undefined1 high_precision;
  Vector<double> *new_acceleration_00;
  int iVar3;
  array<double,_3UL> new_position;
  array<ruckig::Bound,_3UL> position_extrema;
  array<double,_3UL> new_acceleration;
  array<double,_3UL> new_velocity;
  Trajectory<3UL,_ruckig::StandardVector> trajectory;
  InputParameter<3UL,_ruckig::StandardVector> input;
  Ruckig<3UL,_ruckig::StandardVector,_false> otg;
  
  ruckig::InputParameter<3UL,_ruckig::StandardVector>::InputParameter<3UL,_0>(&input);
  input.current_position._M_elems[2] = 0.5;
  input.current_position._M_elems[0] = 0.0;
  input.current_position._M_elems[1] = 0.0;
  input.current_velocity._M_elems[2] = -0.5;
  input.current_velocity._M_elems[0] = 0.0;
  input.current_velocity._M_elems[1] = -2.2;
  input.current_acceleration._M_elems[2] = -0.5;
  input.current_acceleration._M_elems[0] = 0.0;
  input.current_acceleration._M_elems[1] = 2.5;
  input.target_position._M_elems[2] = -3.5;
  input.target_position._M_elems[0] = 5.0;
  input.target_position._M_elems[1] = -2.0;
  input.target_velocity._M_elems[2] = -2.0;
  input.target_velocity._M_elems[0] = 0.0;
  input.target_velocity._M_elems[1] = -0.5;
  input.target_acceleration._M_elems[2] = 0.5;
  input.target_acceleration._M_elems[0] = 0.0;
  input.target_acceleration._M_elems[1] = 0.0;
  input.max_velocity._M_elems[2] = 3.0;
  input.max_velocity._M_elems[0] = 3.0;
  input.max_velocity._M_elems[1] = 1.0;
  input.max_acceleration._M_elems[2] = 1.0;
  input.max_acceleration._M_elems[0] = 3.0;
  input.max_acceleration._M_elems[1] = 2.0;
  input.max_jerk._M_elems[2] = 2.0;
  input.max_jerk._M_elems[0] = 4.0;
  input.max_jerk._M_elems[1] = 3.0;
  input.min_velocity.super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload.
  super__Optional_payload_base<std::array<double,_3UL>_>._M_payload._M_value._M_elems[2] = -3.0;
  input.min_velocity.super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload.
  super__Optional_payload_base<std::array<double,_3UL>_>._M_payload._M_value._M_elems[0] = -2.0;
  input.min_velocity.super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload.
  super__Optional_payload_base<std::array<double,_3UL>_>._M_payload._M_value._M_elems[1] = -0.5;
  if (input.min_velocity.super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload.
      super__Optional_payload_base<std::array<double,_3UL>_>._M_engaged == false) {
    input.min_velocity.super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload.
    super__Optional_payload_base<std::array<double,_3UL>_>._M_engaged = true;
  }
  input.min_acceleration.super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload.
  super__Optional_payload_base<std::array<double,_3UL>_>._M_payload._M_value._M_elems[0] = -2.0;
  input.min_acceleration.super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload.
  super__Optional_payload_base<std::array<double,_3UL>_>._M_payload._M_value._M_elems[1] = -2.0;
  input.min_acceleration.super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload.
  super__Optional_payload_base<std::array<double,_3UL>_>._M_payload._M_value._M_elems[2] = -2.0;
  if (input.min_acceleration.super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload.
      super__Optional_payload_base<std::array<double,_3UL>_>._M_engaged == false) {
    input.min_acceleration.super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload.
    super__Optional_payload_base<std::array<double,_3UL>_>._M_engaged = true;
  }
  ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::Ruckig<3UL,_0>(&otg);
  ruckig::Trajectory<3UL,_ruckig::StandardVector>::Trajectory<3UL,_0>(&trajectory);
  RVar1 = ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::calculate(&otg,&input,&trajectory);
  if (RVar1 == ErrorInvalidInput) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Invalid input!");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar3 = -1;
  }
  else {
    std::operator<<((ostream *)&std::cout,"Trajectory duration: ");
    poVar2 = std::ostream::_M_insert<double>(trajectory.duration);
    poVar2 = std::operator<<(poVar2," [s].");
    std::endl<char,std::char_traits<char>>(poVar2);
    new_acceleration_00 = &new_acceleration;
    ruckig::Trajectory<3UL,_ruckig::StandardVector>::at_time
              (&trajectory,1.0,&new_position,&new_velocity,new_acceleration_00);
    high_precision = SUB81(new_acceleration_00,0);
    std::operator<<((ostream *)&std::cout,"Position at time ");
    poVar2 = std::ostream::_M_insert<double>(1.0);
    poVar2 = std::operator<<(poVar2," [s]: ");
    ruckig::join<std::array<double,3ul>>
              ((string *)&position_extrema,(ruckig *)&new_position,(array<double,_3UL> *)0x0,
               (bool)high_precision);
    poVar2 = std::operator<<(poVar2,(string *)&position_extrema);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&position_extrema);
    ruckig::Trajectory<3UL,_ruckig::StandardVector>::get_position_extrema
              (&position_extrema,&trajectory);
    std::operator<<((ostream *)&std::cout,"Position extremas for DoF 4 are ");
    poVar2 = std::ostream::_M_insert<double>(position_extrema._M_elems[2].min);
    std::operator<<(poVar2," (min) to ");
    poVar2 = std::ostream::_M_insert<double>(position_extrema._M_elems[2].max);
    poVar2 = std::operator<<(poVar2," (max)");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar3 = 0;
  }
  ruckig::Trajectory<3UL,_ruckig::StandardVector>::~Trajectory(&trajectory);
  ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::~Ruckig(&otg);
  ruckig::InputParameter<3UL,_ruckig::StandardVector>::~InputParameter(&input);
  return iVar3;
}

Assistant:

int main() {
    // Create input parameters
    InputParameter<3> input;
    input.current_position = {0.0, 0.0, 0.5};
    input.current_velocity = {0.0, -2.2, -0.5};
    input.current_acceleration = {0.0, 2.5, -0.5};

    input.target_position = {5.0, -2.0, -3.5};
    input.target_velocity = {0.0, -0.5, -2.0};
    input.target_acceleration = {0.0, 0.0, 0.5};

    input.max_velocity = {3.0, 1.0, 3.0};
    input.max_acceleration = {3.0, 2.0, 1.0};
    input.max_jerk = {4.0, 3.0, 2.0};

    // Set different constraints for negative direction
    input.min_velocity = {-2.0, -0.5, -3.0};
    input.min_acceleration = {-2.0, -2.0, -2.0};

    // We don't need to pass the control rate (cycle time) when using only offline features
    Ruckig<3> otg;
    Trajectory<3> trajectory;

    // Calculate the trajectory in an offline manner (outside of the control loop)
    Result result = otg.calculate(input, trajectory);
    if (result == Result::ErrorInvalidInput) {
        std::cout << "Invalid input!" << std::endl;
        return -1;
    }

    // Get duration of the trajectory
    std::cout << "Trajectory duration: " << trajectory.get_duration() << " [s]." << std::endl;

    double new_time = 1.0;

    // Then, we can calculate the kinematic state at a given time
    std::array<double, 3> new_position, new_velocity, new_acceleration;
    trajectory.at_time(new_time, new_position, new_velocity, new_acceleration);

    std::cout << "Position at time " << new_time << " [s]: " << join(new_position) << std::endl;

    // Get some info about the position extrema of the trajectory
    std::array<Bound, 3> position_extrema = trajectory.get_position_extrema();
    std::cout << "Position extremas for DoF 4 are " << position_extrema[2].min << " (min) to " << position_extrema[2].max << " (max)" << std::endl;
}